

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferVAOAttacher::attach
          (BufferVAOAttacher *this,GLuint buffer,GLuint vao)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  double __x;
  MessageBuilder local_198;
  GLuint local_18;
  GLuint local_14;
  GLuint vao_local;
  GLuint buffer_local;
  BufferVAOAttacher *this_local;
  
  local_18 = vao;
  local_14 = buffer;
  _vao_local = this;
  ScaleProgram::setPos(this->m_program,buffer,vao);
  deqp::gls::LifetimeTests::details::ContextWrapper::log
            (&(this->super_Attacher).super_ContextWrapper,__x);
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_198,(char (*) [35])"// Set the `pos` attribute in VAO ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_18);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])" to buffer ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_14);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return;
}

Assistant:

void BufferVAOAttacher::attach (GLuint buffer, GLuint vao)
{
	m_program.setPos(buffer, vao);
	log() << TestLog::Message
		  << "// Set the `pos` attribute in VAO " << vao << " to buffer " << buffer
		  << TestLog::EndMessage;
}